

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ushort *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar8 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar3 = *(ushort *)(puVar2 + uVar8 + 1) << 8 | *(ushort *)(puVar2 + uVar8 + 1) >> 8;
  uVar1 = pPg->pBt->usableSize;
  uVar10 = uVar1 - nByte;
  uVar11 = uVar8 + 1;
  while( true ) {
    uVar6 = (ulong)uVar3;
    uVar4 = (uint)uVar3;
    if ((int)uVar10 < (int)uVar4) {
      if ((int)uVar4 <= (int)(uVar1 - 4)) {
        return (u8 *)0x0;
      }
      iVar5 = 0x10bba;
      goto LAB_00142392;
    }
    puVar7 = (ushort *)(puVar2 + uVar6);
    uVar9 = (uint)(ushort)(*(ushort *)(puVar2 + uVar6 + 2) << 8 |
                          *(ushort *)(puVar2 + uVar6 + 2) >> 8);
    uVar12 = uVar9 - nByte;
    if (-1 < (int)uVar12) break;
    uVar3 = *puVar7 << 8 | *puVar7 >> 8;
    uVar11 = uVar6;
    if ((uint)uVar3 <= uVar9 + uVar4) {
      if (uVar3 != 0) {
        iVar5 = 0x10bb3;
LAB_00142392:
        iVar5 = sqlite3CorruptError(iVar5);
        *pRc = iVar5;
      }
      return (u8 *)0x0;
    }
  }
  if (uVar12 < 4) {
    if (0x39 < puVar2[uVar8 + 7]) {
      return (u8 *)0x0;
    }
    *(ushort *)(puVar2 + uVar11) = *puVar7;
    puVar2[uVar8 + 7] = puVar2[uVar8 + 7] + (char)uVar12;
    return (u8 *)puVar7;
  }
  if (uVar4 + uVar12 <= uVar10) {
    puVar7[1] = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
    return puVar2 + (uVar4 + uVar12);
  }
  iVar5 = 0x10ba4;
  goto LAB_00142392;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  u8 *pTmp = &aData[iAddr];                  /* Temporary ptr into aData[] */
  int pc = get2byte(pTmp);                   /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    pTmp = &aData[pc+2];
    size = get2byte(pTmp);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
        testcase( pc+x>maxPC );
        return &aData[pc];
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pTmp = &aData[pc];
    pc = get2byte(pTmp);
    if( pc<=iAddr+size ){
      if( pc ){
        /* The next slot in the chain is not past the end of the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}